

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.c
# Opt level: O2

size_t WebRtc_WriteBuffer(RingBuffer *self,void *data,size_t element_count)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (data == (void *)0x0 || self == (RingBuffer *)0x0) {
    element_count = 0;
  }
  else {
    sVar2 = WebRtc_available_write(self);
    if (sVar2 < element_count) {
      element_count = sVar2;
    }
    sVar2 = self->write_pos;
    uVar3 = self->element_count - sVar2;
    uVar4 = element_count;
    if (uVar3 <= element_count && element_count - uVar3 != 0) {
      memcpy(self->data + sVar2 * self->element_size,data,uVar3 * self->element_size);
      self->write_pos = 0;
      self->rw_wrap = DIFF_WRAP;
      sVar2 = 0;
      uVar4 = element_count - uVar3;
    }
    sVar1 = self->element_size;
    memcpy(self->data + sVar2 * sVar1,(void *)((long)data + (element_count - uVar4) * sVar1),
           sVar1 * uVar4);
    self->write_pos = self->write_pos + uVar4;
  }
  return element_count;
}

Assistant:

size_t WebRtc_WriteBuffer(RingBuffer* self,
                          const void* data,
                          size_t element_count) {
  if (!self) {
    return 0;
  }
  if (!data) {
    return 0;
  }

  {
    const size_t free_elements = WebRtc_available_write(self);
    const size_t write_elements = (free_elements < element_count ? free_elements
        : element_count);
    size_t n = write_elements;
    const size_t margin = self->element_count - self->write_pos;

    if (write_elements > margin) {
      // Buffer wrap around when writing.
      memcpy(self->data + self->write_pos * self->element_size,
             data, margin * self->element_size);
      self->write_pos = 0;
      n -= margin;
      self->rw_wrap = DIFF_WRAP;
    }
    memcpy(self->data + self->write_pos * self->element_size,
           ((const char*) data) + ((write_elements - n) * self->element_size),
           n * self->element_size);
    self->write_pos += n;

    return write_elements;
  }
}